

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool check_range(int lower,int upper)

{
  int cnt;
  AREA_DATA_conflict *pArea;
  int upper_local;
  int lower_local;
  
  cnt = 0;
  pArea = area_first;
  while( true ) {
    if (pArea == (AREA_DATA_conflict *)0x0) {
      return true;
    }
    if (((lower <= pArea->min_vnum) && (pArea->min_vnum <= upper)) ||
       ((lower <= pArea->max_vnum && (pArea->max_vnum <= upper)))) {
      cnt = cnt + 1;
    }
    if (1 < cnt) break;
    pArea = pArea->next;
  }
  return false;
}

Assistant:

bool check_range(int lower, int upper)
{
	AREA_DATA *pArea;
	int cnt = 0;

	for (pArea = area_first; pArea; pArea = pArea->next)
	{
		/*
		 * lower < area < upper
		 */
		if ((lower <= pArea->min_vnum && pArea->min_vnum <= upper)
			|| (lower <= pArea->max_vnum && pArea->max_vnum <= upper))
		{
			++cnt;
		}

		if (cnt > 1)
			return false;
	}

	return true;
}